

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O2

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>>::
applyHouseholderOnTheRight<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,_1,true>> *this,
          Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>
          *essential,Scalar *tau,Scalar *workspace)

{
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false> *local_188;
  Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_> tmp;
  CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_170;
  undefined1 local_158 [24];
  PointerType local_140;
  Nested local_130;
  Index IStack_128;
  Index local_120;
  CoeffBasedProduct<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_6>
  local_118;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false> right;
  
  if (*(long *)(this + 0x10) == 1) {
    local_118.m_lhs.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_0>
    .m_data = (PointerType)(1.0 - *tau);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>_>::operator*=
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>_> *)this,
               (Scalar *)&local_118);
  }
  else {
    tmp._0_8_ = workspace;
    Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>::Block
              (&right,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true> *)this,0,1,2,
               *(long *)(this + 0x10) + -1);
    CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>,2,-1,false>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,-1,1,false>const,6>
    ::
    CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,_1,true>,2,_1,false>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>>
              ((CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,_1,true>,2,_1,false>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>const,6>
                *)&local_118,&right,essential);
    internal::
    assign_impl<Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::CoeffBasedProduct<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>,_6>,_0,_0,_0>
    ::run(&tmp,&local_118);
    Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_1,_true>::Block
              ((Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,_1,_true> *
               )&local_118,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true> *)this,0);
    MatrixBase<Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>,0,Eigen::Stride<0,0>>>::operator+=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>,0,Eigen::Stride<0,0>>> *)&tmp,
               (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,_1,_true>_>
                *)&local_118);
    local_158._16_8_ = *tau;
    local_158._0_8_ = tmp._0_8_;
    Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_1,_true>::Block
              ((Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,_1,_true> *
               )&local_118,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true> *)this,0);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>,2,1,true>>::
    operator-=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,_1,true>,2,1,true>>
                *)&local_118,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)local_158);
    local_170.m_functor.m_other = *tau;
    local_170.m_xpr._0_8_ = tmp._0_8_;
    local_158._0_8_ =
         (essential->
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
         ).
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
         .m_data;
    local_158._8_8_ =
         (essential->
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
         ).
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
         .m_rows.m_value;
    local_140 = (essential->
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
                ).
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
                .m_xpr.
                super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_1>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_0>.
                m_data;
    local_130 = (essential->
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
                ).
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
                .m_xpr.
                super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.m_xpr;
    IStack_128 = (essential->
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
                 .m_xpr.
                 super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.
                 m_outerStride;
    local_120 = (essential->
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
                ).
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
                .m_outerStride;
    CoeffBasedProduct<Eigen::Matrix<double,2,1,0,2,1>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,-1,1,false>const>const,256>
    ::
    CoeffBasedProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>const>>
              ((CoeffBasedProduct<Eigen::Matrix<double,2,1,0,2,1>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>const>const,256>
                *)&local_118,&local_170,
               (Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                *)local_158);
    local_188 = &right;
    NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>,2,-1,false>,Eigen::MatrixBase>
    ::operator-=((NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,_1,true>,2,_1,false>,Eigen::MatrixBase>
                  *)&local_188,
                 (CoeffBasedProduct<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_256>
                  *)&local_118);
  }
  return;
}

Assistant:

void MatrixBase<Derived>::applyHouseholderOnTheRight(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(cols() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else
  {
    Map<typename internal::plain_col_type<PlainObject>::type> tmp(workspace,rows());
    Block<Derived, Derived::RowsAtCompileTime, EssentialPart::SizeAtCompileTime> right(derived(), 0, 1, rows(), cols()-1);
    tmp.noalias() = right * essential.conjugate();
    tmp += this->col(0);
    this->col(0) -= tau * tmp;
    right.noalias() -= tau * tmp * essential.transpose();
  }
}